

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::EnableProfilingSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig CStack_1f8;
  
  pCVar1 = ClientConfig::GetConfig(context);
  switchD_016d4fed::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  pCVar1->profiler_print_format = CStack_1f8.profiler_print_format;
  ClientConfig::~ClientConfig(&CStack_1f8);
  switchD_016d4fed::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  pCVar1->enable_profiler = CStack_1f8.enable_profiler;
  ClientConfig::~ClientConfig(&CStack_1f8);
  switchD_016d4fed::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  pCVar1->emit_profiler_output = CStack_1f8.emit_profiler_output;
  ClientConfig::~ClientConfig(&CStack_1f8);
  switchD_016d4fed::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::operator=(&(pCVar1->profiler_settings)._M_h,&CStack_1f8.profiler_settings._M_h);
  ClientConfig::~ClientConfig(&CStack_1f8);
  return;
}

Assistant:

void EnableProfilingSetting::ResetLocal(ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);
	config.profiler_print_format = ClientConfig().profiler_print_format;
	config.enable_profiler = ClientConfig().enable_profiler;
	config.emit_profiler_output = ClientConfig().emit_profiler_output;
	config.profiler_settings = ClientConfig().profiler_settings;
}